

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::Heap::Heap(Heap *this,VirtualMachine *param_1)

{
  this->_vptr_Heap = (_func_int **)&PTR__Heap_00139990;
  (this->createdStrings).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->createdStrings;
  (this->createdStrings).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->createdStrings;
  (this->createdStrings).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->createdFunctions).
  super__List_base<runtime::Function_*,_std::allocator<runtime::Function_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->createdFunctions;
  (this->createdFunctions).
  super__List_base<runtime::Function_*,_std::allocator<runtime::Function_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->createdFunctions;
  (this->createdFunctions).
  super__List_base<runtime::Function_*,_std::allocator<runtime::Function_*>_>._M_impl._M_node.
  _M_size = 0;
  (this->createdObjects).super__List_base<runtime::Object_*,_std::allocator<runtime::Object_*>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->createdObjects;
  (this->createdObjects).super__List_base<runtime::Object_*,_std::allocator<runtime::Object_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->createdObjects;
  (this->createdObjects).super__List_base<runtime::Object_*,_std::allocator<runtime::Object_*>_>.
  _M_impl._M_node._M_size = 0;
  return;
}

Assistant:

runtime::Heap::Heap(runtime::VirtualMachine* /*vm*/) noexcept {

}